

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codadump-debug.c
# Opt level: O2

void print_debug_data(char *product_class,char *product_type,int format_version)

{
  int iVar1;
  int *piVar2;
  coda_product *pf;
  coda_format format;
  coda_cursor cursor;
  
  if (product_class == (char *)0x0) {
    iVar1 = coda_open(traverse_info.file_name,&pf);
  }
  else {
    iVar1 = coda_open_as(traverse_info.file_name,product_class,product_type,format_version,&pf);
  }
  if (iVar1 != 0) {
    piVar2 = (int *)coda_get_errno();
    if (*piVar2 == -0x15) {
      coda_set_option_use_mmap(0);
      if (product_class == (char *)0x0) {
        iVar1 = coda_open(traverse_info.file_name,&pf);
      }
      else {
        iVar1 = coda_open_as(traverse_info.file_name,product_class,product_type,format_version,&pf);
      }
      coda_set_option_use_mmap(1);
      if (iVar1 == 0) goto LAB_0010411f;
    }
    handle_coda_error();
  }
LAB_0010411f:
  iVar1 = coda_get_product_format(pf,&format);
  if (iVar1 != 0) {
    handle_coda_error();
  }
  print_offsets = (int)(format < coda_format_hdf4);
  iVar1 = coda_cursor_set_product(&cursor,pf);
  if (iVar1 != 0) {
    handle_coda_error();
  }
  if (starting_path != (char *)0x0) {
    iVar1 = coda_cursor_goto(&cursor);
    if (iVar1 != 0) {
      handle_coda_error();
    }
  }
  coda_set_option_perform_boundary_checks(0);
  print_data(&cursor,0);
  coda_close(pf);
  return;
}

Assistant:

void print_debug_data(const char *product_class, const char *product_type, int format_version)
{
    coda_product *pf;
    coda_cursor cursor;
    coda_format format;
    int result;

    if (product_class == NULL)
    {
        result = coda_open(traverse_info.file_name, &pf);
    }
    else
    {
        result = coda_open_as(traverse_info.file_name, product_class, product_type, format_version, &pf);
    }
    if (result != 0 && coda_errno == CODA_ERROR_FILE_OPEN)
    {
        /* maybe not enough memory space to map the file in memory =>
         * temporarily disable memory mapping of files and try again
         */
        coda_set_option_use_mmap(0);
        if (product_class == NULL)
        {
            result = coda_open(traverse_info.file_name, &pf);
        }
        else
        {
            result = coda_open_as(traverse_info.file_name, product_class, product_type, format_version, &pf);
        }
        coda_set_option_use_mmap(1);
    }
    if (result != 0)
    {
        handle_coda_error();
    }

    if (coda_get_product_format(pf, &format) != 0)
    {
        handle_coda_error();
    }
    print_offsets = (format == coda_format_ascii || format == coda_format_binary || format == coda_format_xml);

    if (coda_cursor_set_product(&cursor, pf) != 0)
    {
        handle_coda_error();
    }
    if (starting_path != NULL)
    {
        result = coda_cursor_goto(&cursor, starting_path);
        if (result != 0)
        {
            handle_coda_error();
        }
    }

    coda_set_option_perform_boundary_checks(0);
    print_data(&cursor, 0);

    coda_close(pf);
}